

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O0

void __thiscall ALCdevice::ProcessAmbiDecStablized(ALCdevice *this,size_t SamplesToDo)

{
  long in_RDI;
  ALuint cidx;
  ALuint ridx;
  ALuint lidx;
  size_t in_stack_00000158;
  size_t in_stack_00000160;
  FloatBufferLine *in_stack_00000168;
  BFormatDec *in_stack_00000170;
  undefined1 in_stack_00000178 [16];
  size_t in_stack_00000190;
  size_t in_stack_00000198;
  size_type in_stack_ffffffffffffffa8;
  array<unsigned_int,_16UL> *in_stack_ffffffffffffffb0;
  
  std::array<unsigned_int,_16UL>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::array<unsigned_int,_16UL>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::array<unsigned_int,_16UL>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::operator->
            ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)0x1a5d73);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::data
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDI + 0x6de8));
  BFormatDec::processStablize
            (in_stack_00000170,
             (span<std::array<float,_1024UL>,_18446744073709551615UL>)in_stack_00000178,
             in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000190,
             in_stack_00000198);
  return;
}

Assistant:

void ALCdevice::ProcessAmbiDecStablized(const size_t SamplesToDo)
{
    /* Decode with front image stablization. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};
    const ALuint cidx{RealOut.ChannelIndex[FrontCenter]};

    AmbiDecoder->processStablize(RealOut.Buffer, Dry.Buffer.data(), lidx, ridx, cidx,
        SamplesToDo);
}